

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

char * bloaty::GetDataSourceLabel(DataSource source)

{
  uint in_EDI;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    if (9 < local_10) {
      fprintf(_stderr,"Unknown data source label: %d\n",(ulong)in_EDI);
      exit(1);
    }
    if (*(uint *)(data_sources + local_10 * 0x18) == in_EDI) break;
    local_10 = local_10 + 1;
  }
  return *(char **)(data_sources + local_10 * 0x18 + 8);
}

Assistant:

const char* GetDataSourceLabel(DataSource source) {
  for (size_t i = 0; i < ARRAY_SIZE(data_sources); i++) {
    if (data_sources[i].number == source) {
      return data_sources[i].name;
    }
  }
  fprintf(stderr, "Unknown data source label: %d\n", static_cast<int>(source));
  exit(1);
  return nullptr;
}